

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  string *psVar5;
  ostream *poVar6;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  PolicyID id_05;
  PolicyID id_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string version;
  string compilerId;
  string compilerIdVar;
  ostringstream w;
  string emulated;
  string emulatedId;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  long *local_248 [2];
  long local_238 [2];
  string local_228;
  string local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  pointer local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  undefined8 local_1a8;
  ios_base local_178 [264];
  string local_70;
  string local_50;
  
  local_1e8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  local_1e8._8_8_ = "CMAKE_";
  local_1d8._M_allocated_capacity = 0;
  local_1c8 = (lang->_M_dataplus)._M_p;
  local_1d8._8_8_ = lang->_M_string_length;
  local_1c0 = 0;
  local_1b8 = 0xc;
  local_1b0 = "_COMPILER_ID";
  local_1a8 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_1e8;
  cmCatViews(&local_228,views);
  psVar5 = cmMakefile::GetSafeDefinition(mf,&local_228);
  local_248[0] = local_238;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar1,pcVar1 + psVar5->_M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)local_248);
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_
                ((string *)local_1e8,(cmPolicies *)&DAT_00000019,id_00);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != &local_1d8) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
      }
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_0044ec8f;
        bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_208,"CMAKE_POLICY_WARNING_CMP0025","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)&DAT_00000019,id_03);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1e8,local_2a8._M_dataplus._M_p,
                              local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," compiler id \"AppleClang\" to \"Clang\" for compatibility.",0x37);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
        }
      }
      value._M_str = "Clang";
      value._M_len = 5;
      cmMakefile::AddDefinition(mf,&local_228,value);
    }
  }
LAB_0044ec8f:
  iVar3 = std::__cxx11::string::compare((char *)local_248);
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x2f,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != &local_1d8) goto LAB_0044f2ac;
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_0044ecab;
        bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,"CMAKE_POLICY_WARNING_CMP0047","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2c8,(cmPolicies *)0x2f,id_04);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1e8,local_2c8._M_dataplus._M_p,
                              local_2c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," compiler id \"QCC\" to \"GNU\" for compatibility.",0x2e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
        }
      }
      value_00._M_str = "GNU";
      value_00._M_len = 3;
      cmMakefile::AddDefinition(mf,&local_228,value_00);
      iVar3 = std::__cxx11::string::compare((char *)lang);
      if (iVar3 == 0) {
        local_1e8._0_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCC","");
        value_02._M_str = "1";
        value_02._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_02);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)lang);
        if (iVar3 != 0) goto LAB_0044ecab;
        local_1e8._0_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCXX","");
        value_01._M_str = "1";
        value_01._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_01);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != &local_1d8) {
LAB_0044f2ac:
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
      }
    }
  }
LAB_0044ecab:
  iVar3 = std::__cxx11::string::compare((char *)local_248);
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x59,id_02);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != &local_1d8) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
      }
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_0044ecc7;
        bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,"CMAKE_POLICY_WARNING_CMP0089","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_288,(cmPolicies *)0x59,id_05);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1e8,local_288._M_dataplus._M_p,
                              local_288._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," compiler id \"XLClang\" to \"XL\" for compatibility.",0x31);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
        }
      }
      value_03._M_str = "XL";
      value_03._M_len = 2;
      cmMakefile::AddDefinition(mf,&local_228,value_03);
    }
  }
LAB_0044ecc7:
  iVar3 = std::__cxx11::string::compare((char *)local_248);
  if (iVar3 != 0) goto LAB_0044f83d;
  PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0129,false);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x81,id);
    cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
    local_268.field_2._M_allocated_capacity = local_1d8._M_allocated_capacity;
    local_268._M_dataplus._M_p = (pointer)local_1e8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ == &local_1d8) goto LAB_0044f83d;
  }
  else {
    if (PVar4 != OLD) {
      if (PVar4 != WARN) goto LAB_0044f83d;
      bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"CMAKE_POLICY_WARNING_CMP0129","");
        bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar2 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_268,(cmPolicies *)0x81,id_06);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1e8,local_268._M_dataplus._M_p,
                            local_268._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," compiler id \"LCC\" to \"GNU\" for compatibility.",0x2e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          (ulong)(local_268.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          (ulong)(local_268.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
      }
    }
    value_04._M_str = "GNU";
    value_04._M_len = 3;
    cmMakefile::AddDefinition(mf,&local_228,value_04);
    iVar3 = std::__cxx11::string::compare((char *)lang);
    if (iVar3 == 0) {
      local_1e8._0_8_ = &local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCC","");
      value_06._M_str = "1";
      value_06._M_len = 1;
      cmMakefile::AddDefinition(mf,(string *)local_1e8,value_06);
LAB_0044f683:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != &local_1d8) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)lang);
      if (iVar3 == 0) {
        local_1e8._0_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCXX","");
        value_07._M_str = "1";
        value_07._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_07);
        goto LAB_0044f683;
      }
      iVar3 = std::__cxx11::string::compare((char *)lang);
      if (iVar3 == 0) {
        local_1e8._0_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUG77","");
        value_05._M_str = "1";
        value_05._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_05);
        goto LAB_0044f683;
      }
    }
    local_1e8._0_8_ = (pointer)0x6;
    local_1e8._8_8_ = "CMAKE_";
    local_1d8._M_allocated_capacity = 0;
    local_1c8 = (lang->_M_dataplus)._M_p;
    local_1d8._8_8_ = lang->_M_string_length;
    local_1c0 = 0;
    local_1b8 = 0x11;
    local_1b0 = "_COMPILER_VERSION";
    local_1a8 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_1e8;
    cmCatViews(&local_268,views_00);
    local_1e8._0_8_ = (pointer)0x6;
    local_1e8._8_8_ = "CMAKE_";
    local_1d8._M_allocated_capacity = 0;
    local_1c8 = (lang->_M_dataplus)._M_p;
    local_1d8._8_8_ = lang->_M_string_length;
    local_1c0 = 0;
    local_1b8 = 0x11;
    local_1b0 = "_SIMULATE_VERSION";
    local_1a8 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_1e8;
    cmCatViews(&local_70,views_01);
    local_1e8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x6;
    local_1e8._8_8_ = "CMAKE_";
    local_1d8._M_allocated_capacity = 0;
    local_1c8 = (lang->_M_dataplus)._M_p;
    local_1d8._8_8_ = lang->_M_string_length;
    local_1c0 = 0;
    local_1b8 = 0xc;
    local_1b0 = "_SIMULATE_ID";
    local_1a8 = 0;
    views_02._M_len = 3;
    views_02._M_array = (iterator)local_1e8;
    cmCatViews(&local_50,views_02);
    psVar5 = cmMakefile::GetRequiredDefinition(mf,&local_70);
    value_08._M_str = (psVar5->_M_dataplus)._M_p;
    value_08._M_len = psVar5->_M_string_length;
    cmMakefile::AddDefinition(mf,&local_268,value_08);
    cmMakefile::RemoveDefinition(mf,&local_50);
    cmMakefile::RemoveDefinition(mf,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == &local_268.field_2) goto LAB_0044f83d;
  }
  operator_delete(local_268._M_dataplus._M_p,
                  (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_268.field_2._M_allocated_capacity)->_M_dataplus)._M_p +
                         1));
LAB_0044f83d:
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = cmStrCat("CMAKE_", lang, "_COMPILER_ID");
  std::string const compilerId = mf->GetSafeDefinition(compilerIdVar);

  if (compilerId == "AppleClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            R"( compiler id "AppleClang" to "Clang" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "QCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            R"( compiler id "QCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (compilerId == "XLClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            R"( compiler id "XLClang" to "XL" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "LCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0129)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0129")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0129) << "\n"
            "Converting " << lang <<
            R"( compiler id "LCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert LCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        } else if (lang == "Fortran") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUG77", "1");
        }
        {
          // Fix compiler versions.
          std::string version = cmStrCat("CMAKE_", lang, "_COMPILER_VERSION");
          std::string emulated = cmStrCat("CMAKE_", lang, "_SIMULATE_VERSION");
          std::string emulatedId = cmStrCat("CMAKE_", lang, "_SIMULATE_ID");
          std::string const& actual = mf->GetRequiredDefinition(emulated);
          mf->AddDefinition(version, actual);
          mf->RemoveDefinition(emulatedId);
          mf->RemoveDefinition(emulated);
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0129));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep LCC.
        break;
    }
  }
}